

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
duckdb_re2::Prog::ComputeHints
          (Prog *this,vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_> *flat,
          int begin,int end)

{
  uint16_t *puVar1;
  byte bVar2;
  byte bVar3;
  pointer pIVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int foldhi;
  uint hi;
  int foldlo;
  uint uVar8;
  int local_48c;
  int first;
  int local_484;
  vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_> *local_480;
  Bitmap256 local_478;
  anon_class_32_4_bbdeb633 Recolor;
  int colors [256];
  
  local_478.words_[2] = 0;
  local_478.words_[3] = 0;
  local_478.words_[0] = 0;
  local_478.words_[1] = 0;
  bVar7 = false;
  iVar6 = end;
  local_484 = begin;
  local_480 = flat;
  do {
    if (iVar6 < begin) {
      return;
    }
    if (iVar6 == end) {
LAB_00eb5336:
      if (bVar7) {
        local_478.words_[0] = 0;
        local_478.words_[1] = 0;
        local_478.words_[2] = 0;
        local_478.words_[3] = 0x8000000000000000;
      }
      else {
        local_478.words_[3] = local_478.words_[3] | 0x8000000000000000;
      }
      bVar7 = false;
      colors[0xff] = iVar6;
    }
    else {
      pIVar4 = (flat->
               super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((pIVar4[iVar6].out_opcode_ & 7) != 2) goto LAB_00eb5336;
      Recolor.splits = &local_478;
      Recolor.colors = &colors;
      Recolor.first = &first;
      Recolor.id = &local_48c;
      bVar2 = pIVar4[iVar6].field_1.byte_range.lo_;
      uVar8 = (uint)bVar2;
      bVar3 = pIVar4[iVar6].field_1.byte_range.hi_;
      hi = (uint)bVar3;
      local_48c = iVar6;
      first = end;
      ComputeHints::anon_class_32_4_bbdeb633::operator()(&Recolor,(uint)bVar2,hi);
      if (((0x60 < bVar3) && (bVar2 < 0x7b)) &&
         ((pIVar4[iVar6].field_1.byte_range.hint_foldcase_ & 1) != 0)) {
        if (bVar2 < 0x62) {
          uVar8 = 0x61;
        }
        if (0x79 < hi) {
          hi = 0x7a;
        }
        if (uVar8 <= hi) {
          ComputeHints::anon_class_32_4_bbdeb633::operator()(&Recolor,uVar8 - 0x20,hi - 0x20);
        }
      }
      if (first != end) {
        iVar5 = first - local_48c;
        if (0x7ffe < iVar5) {
          iVar5 = 0x7fff;
        }
        puVar1 = &pIVar4[iVar6].field_1.byte_range.hint_foldcase_;
        *puVar1 = *puVar1 | (short)iVar5 * 2;
      }
      bVar7 = true;
      flat = local_480;
      iVar6 = local_48c;
      begin = local_484;
    }
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

void Prog::ComputeHints(std::vector<Inst>* flat, int begin, int end) {
  Bitmap256 splits;
  int colors[256];

  bool dirty = false;
  for (int id = end; id >= begin; --id) {
    if (id == end ||
        (*flat)[id].opcode() != kInstByteRange) {
      if (dirty) {
        dirty = false;
        splits.Clear();
      }
      splits.Set(255);
      colors[255] = id;
      // At this point, the [0-255] range is colored with id.
      // Thus, hints cannot point beyond id; and if id == end,
      // hints that would have pointed to id will be 0 instead.
      continue;
    }
    dirty = true;

    // We recolor the [lo-hi] range with id. Note that first ratchets backwards
    // from end to the nearest conflict (if any) during recoloring.
    int first = end;
    auto Recolor = [&](int lo, int hi) {
      // Like ByteMapBuilder, we split at lo-1 and at hi.
      --lo;

      if (0 <= lo && !splits.Test(lo)) {
        splits.Set(lo);
        int next = splits.FindNextSetBit(lo+1);
        colors[lo] = colors[next];
      }
      if (!splits.Test(hi)) {
        splits.Set(hi);
        int next = splits.FindNextSetBit(hi+1);
        colors[hi] = colors[next];
      }

      int c = lo+1;
      while (c < 256) {
        int next = splits.FindNextSetBit(c);
        // Ratchet backwards...
        first = std::min(first, colors[next]);
        // Recolor with id - because it's the new nearest conflict!
        colors[next] = id;
        if (next == hi)
          break;
        c = next+1;
      }
    };

    Inst* ip = &(*flat)[id];
    int lo = ip->lo();
    int hi = ip->hi();
    Recolor(lo, hi);
    if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
      int foldlo = lo;
      int foldhi = hi;
      if (foldlo < 'a')
        foldlo = 'a';
      if (foldhi > 'z')
        foldhi = 'z';
      if (foldlo <= foldhi) {
        foldlo += 'A' - 'a';
        foldhi += 'A' - 'a';
        Recolor(foldlo, foldhi);
      }
    }

    if (first != end) {
      uint16_t hint = static_cast<uint16_t>(std::min(first - id, 32767));
      ip->byte_range.hint_foldcase_ |= hint<<1;
    }
  }
}